

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForMultipleInputParameters_Test::testBody
          (TEST_MockExpectedCall_toStringForMultipleInputParameters_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_118 [48];
  SimpleString local_e8 [2];
  SimpleString local_c8;
  undefined1 local_b8 [8];
  MockCheckedExpectedCall expectedCall;
  uint uint_value;
  int int_value;
  TEST_MockExpectedCall_toStringForMultipleInputParameters_Test *this_local;
  
  expectedCall._156_4_ = 10;
  expectedCall.expectedCalls_ = 7;
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b8,1);
  SimpleString::SimpleString(&local_c8,"name");
  MockCheckedExpectedCall::withName((MockCheckedExpectedCall *)local_b8,&local_c8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::SimpleString(local_e8,"string");
  MockExpectedCall::withParameter((MockExpectedCall *)local_b8,local_e8,"value");
  SimpleString::~SimpleString(local_e8);
  SimpleString::SimpleString((SimpleString *)(local_118 + 0x20),"integer");
  MockExpectedCall::withParameter
            ((MockExpectedCall *)local_b8,(SimpleString *)(local_118 + 0x20),expectedCall._156_4_);
  SimpleString::~SimpleString((SimpleString *)(local_118 + 0x20));
  SimpleString::SimpleString((SimpleString *)(local_118 + 0x10),"unsigned-integer");
  MockExpectedCall::withParameter
            ((MockExpectedCall *)local_b8,(SimpleString *)(local_118 + 0x10),
             expectedCall.expectedCalls_);
  SimpleString::~SimpleString((SimpleString *)(local_118 + 0x10));
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b8,1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_118);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_118);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "name -> const char* string: <value>, int integer: <10 (0xa)>, unsigned int unsigned-integer: <7 (0x7)> (expected 1 call, called 1 time)"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x24a,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_118);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b8);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForMultipleInputParameters)
{
    int int_value = 10;
    unsigned int uint_value = 7;

    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withParameter("string", "value");
    expectedCall.withParameter("integer", int_value);
    expectedCall.withParameter("unsigned-integer", uint_value);
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const char* string: <value>, int integer: <10 (0xa)>, unsigned int unsigned-integer: <7 (0x7)> "
                 "(expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}